

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O2

int mbedtls_net_connect(mbedtls_net_context *ctx,char *host,char *port,int proto)

{
  addrinfo *paVar1;
  int iVar2;
  int iVar3;
  addrinfo **__pai;
  addrinfo *addr_list;
  addrinfo local_58;
  
  net_prepare();
  local_58.ai_protocol = 6;
  if (proto == 1) {
    local_58.ai_protocol = 0x11;
  }
  local_58.ai_flags = 0;
  local_58.ai_family = 0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_socktype = (proto == 1) + 1;
  __pai = (addrinfo **)&addr_list;
  iVar2 = getaddrinfo(host,port,&local_58,__pai);
  iVar3 = -0x52;
  if (iVar2 == 0) {
    iVar3 = -0x52;
    while( true ) {
      paVar1 = *__pai;
      if (paVar1 == (addrinfo *)0x0) break;
      iVar2 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      ctx->fd = iVar2;
      iVar3 = -0x42;
      if (-1 < iVar2) {
        iVar3 = connect(iVar2,paVar1->ai_addr,paVar1->ai_addrlen);
        if (iVar3 == 0) {
          iVar3 = 0;
          break;
        }
        close(ctx->fd);
        iVar3 = -0x44;
      }
      __pai = &paVar1->ai_next;
    }
    freeaddrinfo((addrinfo *)addr_list);
  }
  return iVar3;
}

Assistant:

int mbedtls_net_connect( mbedtls_net_context *ctx, const char *host, const char *port, int proto )
{
    int ret;
    struct addrinfo hints, *addr_list, *cur;

    if( ( ret = net_prepare() ) != 0 )
        return( ret );

    /* Do name resolution with both IPv6 and IPv4 */
    memset( &hints, 0, sizeof( hints ) );
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = proto == MBEDTLS_NET_PROTO_UDP ? SOCK_DGRAM : SOCK_STREAM;
    hints.ai_protocol = proto == MBEDTLS_NET_PROTO_UDP ? IPPROTO_UDP : IPPROTO_TCP;

    if( getaddrinfo( host, port, &hints, &addr_list ) != 0 )
        return( MBEDTLS_ERR_NET_UNKNOWN_HOST );

    /* Try the sockaddrs until a connection succeeds */
    ret = MBEDTLS_ERR_NET_UNKNOWN_HOST;
    for( cur = addr_list; cur != NULL; cur = cur->ai_next )
    {
        ctx->fd = (int) socket( cur->ai_family, cur->ai_socktype,
                            cur->ai_protocol );
        if( ctx->fd < 0 )
        {
            ret = MBEDTLS_ERR_NET_SOCKET_FAILED;
            continue;
        }

        if( connect( ctx->fd, cur->ai_addr, MSVC_INT_CAST cur->ai_addrlen ) == 0 )
        {
            ret = 0;
            break;
        }

        close( ctx->fd );
        ret = MBEDTLS_ERR_NET_CONNECT_FAILED;
    }

    freeaddrinfo( addr_list );

    return( ret );
}